

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::Argument_Binding::Argument_Binding
          (Argument_Binding *this,Argument_Binding *from)

{
  void *pvVar1;
  Value *pVVar2;
  Value *from_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Argument_Binding_00433f58;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 1) {
    pVVar2 = (from->binding_).value_;
    clear_binding(this);
    this->_oneof_case_[0] = 1;
    (this->binding_).value_ =
         (Value *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(this->binding_).name_,(string *)pVVar2);
  }
  else if (from->_oneof_case_[0] == 2) {
    clear_binding(this);
    this->_oneof_case_[0] = 2;
    pVVar2 = (Value *)operator_new(0x30);
    Value::Value(pVVar2);
    (this->binding_).value_ = pVVar2;
    if (from->_oneof_case_[0] == 2) {
      from_00 = (from->binding_).value_;
    }
    else {
      protobuf_MIL_2eproto::InitDefaults();
      from_00 = (Value *)&_Value_default_instance_;
    }
    Value::MergeFrom(pVVar2,from_00);
  }
  return;
}

Assistant:

Argument_Binding::Argument_Binding(const Argument_Binding& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_binding();
  switch (from.binding_case()) {
    case kName: {
      set_name(from.name());
      break;
    }
    case kValue: {
      mutable_value()->::CoreML::Specification::MILSpec::Value::MergeFrom(from.value());
      break;
    }
    case BINDING_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.Argument.Binding)
}